

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStreamTest.hpp
# Opt level: O2

void Qentem::Test::TestStringStream1(QTest *test)

{
  undefined8 uVar1;
  bool bVar2;
  SizeT SVar3;
  char *pcVar4;
  size_t sVar5;
  String<char> n_str;
  SimpleStream sis;
  StringStream<char> ss2;
  StringStream<char> ss1;
  String<char> str;
  uint local_44;
  SizeT local_40;
  SizeT lss;
  char *ss2_p;
  
  ss1.storage_ = (char *)0x0;
  ss1.length_ = 0;
  ss1.capacity_ = 0;
  StringStream<char>::StringStream(&ss2,10);
  n_str.storage_._0_4_ = 0;
  str.storage_ = (char *)0x0;
  str.length_ = 0;
  sis.str[0] = '\0';
  sis.str[1] = '\0';
  sis.str[2] = '\0';
  sis.str[3] = '\0';
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x25);
  sis.str[0] = '\0';
  sis.str[1] = '\0';
  sis.str[2] = '\0';
  sis.str[3] = '\0';
  n_str.storage_._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x26);
  QTest::IsNull(test,(void *)0x0,0x27);
  QTest::IsNull(test,(void *)0x0,0x28);
  uVar1 = ss2._8_8_;
  n_str.storage_._0_4_ = 0x10;
  sis.str[0] = (undefined1)ss2.capacity_;
  sis.str[1] = ss2.capacity_._1_1_;
  sis.str[2] = ss2.capacity_._2_1_;
  sis.str[3] = ss2.capacity_._3_1_;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x2a);
  uVar1 = ss2._8_8_;
  n_str.storage_._0_4_ = 0;
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x2b);
  QTest::IsNotNull(test,ss2.storage_,0x2c);
  StringStream<char>::Reset(&ss2);
  uVar1 = ss2._8_8_;
  n_str.storage_._0_4_ = 0;
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x2f);
  uVar1 = ss2._8_8_;
  n_str.storage_._0_4_ = 0;
  sis.str[0] = (undefined1)ss2.capacity_;
  sis.str[1] = ss2.capacity_._1_1_;
  sis.str[2] = ss2.capacity_._2_1_;
  sis.str[3] = ss2.capacity_._3_1_;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x30);
  QTest::IsNull(test,ss2.storage_,0x31);
  StringStream<char>::StringStream((StringStream<char> *)&sis,1);
  StringStream<char>::operator=(&ss1,(StringStream<char> *)&sis);
  Memory::Deallocate((void *)sis.str._0_8_);
  StringStream<char>::operator+=(&ss1,'a');
  uVar1 = ss1._8_8_;
  sis.str[0] = (undefined1)ss1.length_;
  sis.str[1] = ss1.length_._1_1_;
  sis.str[2] = ss1.length_._2_1_;
  sis.str[3] = ss1.length_._3_1_;
  n_str.storage_._0_4_ = 1;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x35);
  QTest::IsTrue(test,ss1.capacity_ != 0,0x36);
  QTest::IsNotNull(test,ss1.storage_,0x37);
  pcVar4 = ss1.storage_ + (ss1.length_ - 1);
  if (ss1.length_ == 0) {
    pcVar4 = (char *)0x0;
  }
  QTest::IsNotNull(test,pcVar4,0x38);
  sis.str[0] = 'a';
  QTest::IsEqual<char,char>(test,ss1.storage_,sis.str,0x39);
  StringStream<char>::GetString((StringStream<char> *)&sis);
  QTest::IsEqual<Qentem::String<char>,char[2]>
            (test,(String<char> *)&sis,(char (*) [2])0x107189,0x3a);
  Memory::Deallocate((void *)sis.str._0_8_);
  uVar1 = ss1._8_8_;
  n_str.storage_._0_4_ = 0;
  sis.str[0] = (undefined1)ss1.length_;
  sis.str[1] = ss1.length_._1_1_;
  sis.str[2] = ss1.length_._2_1_;
  sis.str[3] = ss1.length_._3_1_;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x3b);
  uVar1 = ss1._8_8_;
  n_str.storage_._0_4_ = 0;
  sis.str[0] = (undefined1)ss1.capacity_;
  sis.str[1] = ss1.capacity_._1_1_;
  sis.str[2] = ss1.capacity_._2_1_;
  sis.str[3] = ss1.capacity_._3_1_;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x3c);
  QTest::IsNull(test,ss1.storage_,0x3d);
  String<char>::String((String<char> *)&sis,"a");
  StringStream<char>::operator+=(&ss2,(String<char> *)&sis);
  Memory::Deallocate((void *)sis.str._0_8_);
  uVar1 = ss2._8_8_;
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  n_str.storage_._0_4_ = 1;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x40);
  QTest::IsTrue(test,ss2.capacity_ != 0,0x41);
  StringStream<char>::GetString((StringStream<char> *)&sis);
  QTest::IsEqual<Qentem::String<char>,char[2]>
            (test,(String<char> *)&sis,(char (*) [2])0x107189,0x42);
  Memory::Deallocate((void *)sis.str._0_8_);
  StringStream<char>::GetString((StringStream<char> *)&sis);
  QTest::IsNotEqual<Qentem::String<char>,char[3]>(test,(String<char> *)&sis,(char (*) [3])"aa",0x43)
  ;
  Memory::Deallocate((void *)sis.str._0_8_);
  String<char>::String((String<char> *)&sis,"a");
  String<char>::operator=(&str,(String<char> *)&sis);
  Memory::Deallocate((void *)sis.str._0_8_);
  StringStream<char>::operator+=(&ss2,&str);
  uVar1 = ss2._8_8_;
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  n_str.storage_._0_4_ = 1;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x47);
  QTest::IsTrue(test,ss2.capacity_ != 0,0x48);
  QTest::IsEqual<Qentem::StringStream<char>,char[2]>(test,&ss2,(char (*) [2])0x107189,0x49);
  QTest::IsNotEqual<Qentem::StringStream<char>,char[3]>(test,&ss2,(char (*) [3])"aa",0x4a);
  StringStream<char>::Reset(&ss2);
  StringStream<char>::operator+=(&ss2,"abc");
  uVar1 = ss2._8_8_;
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  n_str.storage_._0_4_ = 3;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x4f);
  QTest::IsTrue(test,2 < ss2.capacity_,0x50);
  StringStream<char>::GetString((StringStream<char> *)&sis);
  QTest::IsEqual<Qentem::String<char>,char[4]>(test,(String<char> *)&sis,(char (*) [4])"abc",0x51);
  Memory::Deallocate((void *)sis.str._0_8_);
  String<char>::String((String<char> *)&sis,"abc");
  StringStream<char>::operator+=(&ss2,(String<char> *)&sis);
  Memory::Deallocate((void *)sis.str._0_8_);
  uVar1 = ss2._8_8_;
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  n_str.storage_._0_4_ = 3;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x55);
  QTest::IsTrue(test,2 < ss2.capacity_,0x56);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&ss2,(char (*) [4])"abc",0x57);
  StringStream<char>::Reset(&ss2);
  String<char>::String((String<char> *)&sis,"abc");
  String<char>::operator=(&str,(String<char> *)&sis);
  Memory::Deallocate((void *)sis.str._0_8_);
  StringStream<char>::operator+=(&ss2,&str);
  uVar1 = ss2._8_8_;
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  n_str.storage_._0_4_ = 3;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x5c);
  QTest::IsTrue(test,2 < ss2.capacity_,0x5d);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&ss2,(char (*) [4])"abc",0x5e);
  StringStream<char>::Reset(&ss2);
  String<char>::String((String<char> *)&sis,"abc");
  StringStream<char>::operator+=(&ss2,(String<char> *)&sis);
  Memory::Deallocate((void *)sis.str._0_8_);
  StringStream<char>::operator=(&ss1,&ss2);
  uVar1 = ss1._8_8_;
  sis.str[0] = (undefined1)ss1.length_;
  sis.str[1] = ss1.length_._1_1_;
  sis.str[2] = ss1.length_._2_1_;
  sis.str[3] = ss1.length_._3_1_;
  n_str.storage_._0_4_ = ss2.length_;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,99);
  QTest::IsTrue(test,ss2.length_ <= ss1.capacity_,100);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&ss1,(char (*) [4])"abc",0x65);
  StringStream<char>::Reset(&ss1);
  lss = ss1.capacity_;
  sis.str[0] = '\0';
  sis.str[1] = '\0';
  sis.str[2] = '\0';
  sis.str[3] = '\0';
  n_str.storage_._0_4_ = 0;
  ss1._8_8_ = (ulong)ss1.capacity_ << 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x6b);
  uVar1 = ss1._8_8_;
  sis.str[0] = (undefined1)ss1.capacity_;
  sis.str[1] = ss1.capacity_._1_1_;
  sis.str[2] = ss1.capacity_._2_1_;
  sis.str[3] = ss1.capacity_._3_1_;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,&lss,0x6c);
  StringStream<char>::Reset(&ss1);
  StringStream<char>::operator=(&ss1,&ss2);
  uVar1 = ss1._8_8_;
  sis.str[0] = (undefined1)ss1.length_;
  sis.str[1] = ss1.length_._1_1_;
  sis.str[2] = ss1.length_._2_1_;
  sis.str[3] = ss1.length_._3_1_;
  n_str.storage_._0_4_ = 3;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x70);
  QTest::IsTrue(test,2 < ss1.capacity_,0x71);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&ss1,(char (*) [4])"abc",0x72);
  QTest::IsNull(test,ss2.storage_,0x73);
  uVar1 = ss2._8_8_;
  n_str.storage_._0_4_ = 0;
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x74);
  uVar1 = ss2._8_8_;
  n_str.storage_._0_4_ = 0;
  sis.str[0] = (undefined1)ss2.capacity_;
  sis.str[1] = ss2.capacity_._1_1_;
  sis.str[2] = ss2.capacity_._2_1_;
  sis.str[3] = ss2.capacity_._3_1_;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x75);
  QTest::IsNull(test,ss2.storage_,0x76);
  StringStream<char>::operator+=(&ss2,'a');
  StringStream<char>::Reset(&ss1);
  StringStream<char>::operator=(&ss1,&ss2);
  uVar1 = ss1._8_8_;
  sis.str[0] = (undefined1)ss1.length_;
  sis.str[1] = ss1.length_._1_1_;
  sis.str[2] = ss1.length_._2_1_;
  sis.str[3] = ss1.length_._3_1_;
  n_str.storage_._0_4_ = 1;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x7b);
  QTest::IsTrue(test,3 < ss1.capacity_,0x7c);
  QTest::IsEqual<Qentem::StringStream<char>,char[2]>(test,&ss1,(char (*) [2])0x107189,0x7d);
  StringStream<char>::Reset(&ss1);
  StringStream<char>::operator+=(&ss1,"abc");
  StringStream<char>::StringStream((StringStream<char> *)&sis,&ss1);
  StringStream<char>::operator=(&ss2,(StringStream<char> *)&sis);
  Memory::Deallocate((void *)sis.str._0_8_);
  uVar1 = ss1._8_8_;
  sis.str[0] = (undefined1)ss1.length_;
  sis.str[1] = ss1.length_._1_1_;
  sis.str[2] = ss1.length_._2_1_;
  sis.str[3] = ss1.length_._3_1_;
  n_str.storage_._0_4_ = 3;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x82);
  QTest::IsTrue(test,2 < ss1.capacity_,0x83);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&ss1,(char (*) [4])"abc",0x84);
  uVar1 = ss2._8_8_;
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  n_str.storage_._0_4_ = 3;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x85);
  QTest::IsTrue(test,2 < ss2.capacity_,0x86);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&ss2,(char (*) [4])"abc",0x87);
  StringStream<char>::Reset(&ss1);
  StringStream<char>::Reset(&ss2);
  StringStream<char>::operator+=(&ss1,"efg");
  sis.str._8_8_ = ss1._8_8_;
  sis.str._0_8_ = ss1.storage_;
  ss1.storage_ = (char *)0x0;
  ss1.length_ = 0;
  ss1.capacity_ = 0;
  StringStream<char>::operator=(&ss2,(StringStream<char> *)&sis);
  Memory::Deallocate((void *)sis.str._0_8_);
  QTest::IsNull(test,ss1.storage_,0x8d);
  uVar1 = ss1._8_8_;
  n_str.storage_._0_4_ = 0;
  sis.str[0] = (undefined1)ss1.length_;
  sis.str[1] = ss1.length_._1_1_;
  sis.str[2] = ss1.length_._2_1_;
  sis.str[3] = ss1.length_._3_1_;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x8e);
  QTest::IsTrue(test,ss1.capacity_ == 0,0x8f);
  QTest::IsNull(test,ss1.storage_,0x90);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&ss2,(char (*) [4])"efg",0x91);
  uVar1 = ss2._8_8_;
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  n_str.storage_._0_4_ = 3;
  SVar3 = 0;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x92);
  QTest::IsTrue(test,2 < ss2.capacity_,0x93);
  sis.str[0] = 'g';
  sVar5 = 0x94;
  QTest::IsEqual<char,char>(test,ss2.storage_ + 2,sis.str,0x94);
  StringStream<char>::Reset(&ss2);
  StringStream<char>::write(&ss2,0x107189,(void *)0x1,sVar5);
  uVar1 = ss2._8_8_;
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  n_str.storage_._0_4_ = 1;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x98);
  QTest::IsTrue(test,ss2.capacity_ != 0,0x99);
  QTest::IsTrue(test,ss2.capacity_ != 0,0x9a);
  QTest::IsNotNull(test,ss2.storage_,0x9b);
  sVar5 = 0x9c;
  sis.str[0] = 'a';
  QTest::IsEqual<char,char>(test,ss2.storage_,sis.str,0x9c);
  StringStream<char>::write(&ss2,0x10718c,(void *)0x2,sVar5);
  uVar1 = ss2._8_8_;
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  n_str.storage_._0_4_ = 3;
  ss2._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0x9f);
  QTest::IsTrue(test,2 < ss2.capacity_,0xa0);
  sVar5 = 0xa1;
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&ss2,(char (*) [4])"abc",0xa1);
  StringStream<char>::Reset(&ss2);
  StringStream<char>::write(&ss2,0x107193,(void *)0x1,sVar5);
  StringStream<char>::write(&ss2,0x107194,(void *)0x1,sVar5);
  StringStream<char>::write(&ss2,0x107195,(void *)0x1,sVar5);
  pcVar4 = ss2.storage_;
  ss2.storage_ = (char *)0x0;
  ss2.length_ = 0;
  ss2.capacity_ = 0;
  bVar2 = StringUtils::IsEqual<char>(pcVar4,"abc",3);
  Memory::Deallocate(pcVar4);
  QTest::IsTrue(test,bVar2,0xac);
  StringStream<char>::operator+=(&ss2,"abcdef");
  if (9 < ss2.length_) {
    ss2.length_ = ss2.length_ - 10;
  }
  n_str.storage_._0_4_ = 6;
  sis.str._0_4_ = ss2.length_;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0xb0);
  if (ss2.length_ != 0) {
    SVar3 = ss2.length_ - 1;
    ss2.length_ = SVar3;
  }
  n_str.storage_._0_4_ = 5;
  sis.str._0_4_ = SVar3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0xb3);
  if (1 < ss2.length_) {
    ss2.length_ = ss2.length_ - 2;
  }
  n_str.storage_._0_4_ = 3;
  sis.str._0_4_ = ss2.length_;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0xb6);
  if (2 < ss2.length_) {
    ss2.length_ = ss2.length_ - 3;
  }
  n_str.storage_._0_4_ = 0;
  sis.str._0_4_ = ss2.length_;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0xb9);
  StringStream<char>::operator+=(&ss2,"123456789");
  StringStream<char>::operator+=(&ss2,"123456789");
  StringStream<char>::operator+=(&ss2,"123456789");
  StringStream<char>::operator+=(&ss2,"123456789");
  StringStream<char>::operator+=(&ss2,"123456789");
  StringStream<char>::operator+=(&ss2,"123456789");
  StringStream<char>::operator+=(&ss2,"123456789");
  StringStream<char>::operator+=(&ss2,"123456789");
  StringStream<char>::operator+=(&ss2,"123456789");
  StringStream<char>::operator+=(&ss2,"123456789");
  StringStream<char>::operator+=(&ss2,"123456789");
  StringStream<char>::operator+=(&ss2,"123456789");
  StringStream<char>::operator+=(&ss2,"123456789");
  n_str.storage_._0_4_ = 0x75;
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0xc9);
  QTest::IsTrue(test,0x74 < ss2.capacity_,0xca);
  QTest::IsEqual<Qentem::StringStream<char>,char[118]>
            (test,&ss2,
             (char (*) [118])
             "123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789"
             ,0xce);
  StringStream<char>::Reset(&ss1);
  StringStream<char>::Reset(&ss2);
  StringStream<char>::SetLength(&ss1,2);
  uVar1 = ss1._8_8_;
  sis.str[0] = (undefined1)ss1.length_;
  sis.str[1] = ss1.length_._1_1_;
  sis.str[2] = ss1.length_._2_1_;
  sis.str[3] = ss1.length_._3_1_;
  n_str.storage_._0_4_ = 2;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0xd4);
  uVar1 = ss1._8_8_;
  ss1.storage_[0] = 'a';
  ss1.storage_[1] = 'b';
  sis.str[0] = (undefined1)ss1.length_;
  sis.str[1] = ss1.length_._1_1_;
  sis.str[2] = ss1.length_._2_1_;
  sis.str[3] = ss1.length_._3_1_;
  n_str.storage_._0_4_ = 2;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0xdc);
  bVar2 = StringUtils::IsEqual<char>(ss1.storage_,"ab",2);
  QTest::IsTrue(test,bVar2,0xdd);
  pcVar4 = StringStream<char>::Buffer(&ss1,1);
  uVar1 = ss1._8_8_;
  sis.str[0] = (undefined1)ss1.length_;
  sis.str[1] = ss1.length_._1_1_;
  sis.str[2] = ss1.length_._2_1_;
  sis.str[3] = ss1.length_._3_1_;
  n_str.storage_._0_4_ = 3;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0xe0);
  uVar1 = ss1._8_8_;
  *pcVar4 = 'c';
  sis.str[0] = (undefined1)ss1.length_;
  sis.str[1] = ss1.length_._1_1_;
  sis.str[2] = ss1.length_._2_1_;
  sis.str[3] = ss1.length_._3_1_;
  n_str.storage_._0_4_ = 3;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0xe4);
  bVar2 = StringUtils::IsEqual<char>(ss1.storage_,"abc",3);
  QTest::IsTrue(test,bVar2,0xe5);
  ss2.length_ = 0;
  StringStream<char>::operator+=(&ss2,"ab");
  bVar2 = StringStream<char>::operator==(&ss1,&ss2);
  sis.str[0] = bVar2;
  n_str.storage_._0_4_ = (uint)n_str.storage_ & 0xffffff00;
  QTest::IsEqual<bool,bool>(test,(bool *)&sis,(bool *)&n_str,0xe9);
  StringStream<char>::operator+=(&ss1,"de");
  uVar1 = ss1._8_8_;
  sis.str[0] = (undefined1)ss1.length_;
  sis.str[1] = ss1.length_._1_1_;
  sis.str[2] = ss1.length_._2_1_;
  sis.str[3] = ss1.length_._3_1_;
  n_str.storage_._0_4_ = 5;
  ss1._8_8_ = uVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0xec);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,&ss1,(char (*) [6])"abcde",0xed);
  StringStream<char>::operator=(&ss2,&ss1);
  sis.str[0] = (undefined1)ss2.length_;
  sis.str[1] = ss2.length_._1_1_;
  sis.str[2] = ss2.length_._2_1_;
  sis.str[3] = ss2.length_._3_1_;
  n_str.storage_._0_4_ = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&sis,(uint *)&n_str,0xf0);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,&ss2,(char (*) [6])"abcde",0xf1);
  StringStream<char>::Reset(&ss2);
  StringStream<char>::operator+=(&ss2,"123456789123456789123456789123456789");
  ss2_p = ss2.storage_;
  StringStream<char>::GetString((StringStream<char> *)&sis);
  String<char>::operator=(&str,(String<char> *)&sis);
  Memory::Deallocate((void *)sis.str._0_8_);
  sis.str._0_8_ = str.storage_;
  QTest::IsEqual<char_const*,char_const*>(test,&ss2_p,(char **)&sis,0xf9);
  QTest::IsEqual<Qentem::String<char>,char[37]>(test,&str,(char (*) [37])0x1071eb,0xfa);
  StringStream<char>::Reset(&ss2);
  StringStream<char>::operator=(&ss1,"abcdefgh");
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,&ss1,(char (*) [9])"abcdefgh",0x101);
  operator<<(&ss2,&ss1);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,&ss1,(char (*) [9])"abcdefgh",0x104);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,&ss2,(char (*) [9])"abcdefgh",0x105);
  String<char>::String(&n_str,"12345678");
  StringStream<char>::operator=(&ss1,&n_str);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,&ss1,(char (*) [9])0x10723a,0x109);
  StringStream<char>::Reset(&ss2);
  operator<<(&ss2,&n_str);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,&ss2,(char (*) [9])0x10723a,0x10e);
  sis.str[0] = '\0';
  sis.str[1] = '\0';
  sis.str[2] = '\0';
  sis.str[3] = '\0';
  sis.str[4] = '\0';
  sis.str[5] = '\0';
  sis.str[6] = '\0';
  sis.str[7] = '\0';
  sis.str[8] = '\0';
  sis.str[9] = '\0';
  sis.str[10] = '\0';
  sis.str[0xb] = '\0';
  sis.str[0xc] = '\0';
  sis.str[0xd] = '\0';
  sis.str[0xe] = '\0';
  sis.str[0xf] = '\0';
  sis.str[0x10] = '\0';
  sis.str[0x11] = '\0';
  sis.str[0x12] = '\0';
  sis.str[0x13] = '\0';
  sis.str[0x14] = '\0';
  sis.str[0x15] = '\0';
  sis.str[0x16] = '\0';
  sis.str[0x17] = '\0';
  sis.str[0x18] = '\0';
  sis.str[0x19] = '\0';
  sis.str[0x1a] = '\0';
  sis.str[0x1b] = '\0';
  sis.str[0x1c] = '\0';
  sis.str[0x1d] = '\0';
  sis.str[0x1e] = '\0';
  sis.str[0x1f] = '\0';
  sis.max = 0x20;
  sis.index = 0;
  operator<<(&sis,&ss2);
  bVar2 = StringUtils::IsEqual<char>(sis.str,"12345678",8);
  QTest::IsTrue(test,bVar2,0x11d);
  operator<<(&ss2,&n_str);
  QTest::IsEqual<Qentem::StringStream<char>,char[17]>(test,&ss2,(char (*) [17])0x107232,0x120);
  local_44 = 0x20;
  local_40 = ss2.capacity_;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_40,&local_44,0x121);
  operator<<(&ss2,"1234567812345678");
  sis._32_8_ = sis._32_8_ & 0xffffffff;
  operator<<(&sis,&ss2);
  bVar2 = StringUtils::IsEqual<char>(sis.str,"12345678123456781234567812345678",0x20);
  QTest::IsTrue(test,bVar2,0x127);
  if (ss2.length_ != 0) {
    ss2.length_ = ss2.length_ - 1;
  }
  sis._32_8_ = sis._32_8_ & 0xffffffff;
  operator<<(&sis,&ss2);
  bVar2 = StringUtils::IsEqual<char>(sis.str,"1234567",7);
  QTest::IsTrue(test,bVar2,300);
  Memory::Deallocate((void *)CONCAT44(n_str.storage_._4_4_,(uint)n_str.storage_));
  Memory::Deallocate((void *)0x0);
  Memory::Deallocate(str.storage_);
  Memory::Deallocate(ss2.storage_);
  Memory::Deallocate(ss1.storage_);
  return;
}

Assistant:

static void TestStringStream1(QTest &test) {
    StringStream<char> ss1;
    StringStream<char> ss2{10}; // Preset size
    String<char>       str;

    test.IsEqual(ss1.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss1.Capacity(), SizeT{0}, __LINE__);
    test.IsNull(ss1.First(), __LINE__);
    test.IsNull(ss1.Last(), __LINE__);

    test.IsEqual(ss2.Capacity(), SizeT{16}, __LINE__);
    test.IsEqual(ss2.Length(), SizeT{0}, __LINE__);
    test.IsNotNull(ss2.First(), __LINE__);

    ss2.Reset();
    test.IsEqual(ss2.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss2.Capacity(), SizeT{0}, __LINE__);
    test.IsNull(ss2.First(), __LINE__);

    ss1 = StringStream<char>(1);
    ss1 += 'a';
    test.IsEqual(ss1.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss1.Capacity() >= SizeT{1}), __LINE__);
    test.IsNotNull(ss1.First(), __LINE__);
    test.IsNotNull(ss1.Last(), __LINE__);
    test.IsEqual(ss1.First()[0], 'a', __LINE__);
    test.IsEqual(ss1.GetString(), "a", __LINE__);
    test.IsEqual(ss1.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss1.Capacity(), SizeT{0}, __LINE__);
    test.IsNull(ss1.First(), __LINE__);

    ss2 += String<char>("a");
    test.IsEqual(ss2.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{1}), __LINE__);
    test.IsEqual(ss2.GetString(), "a", __LINE__);
    test.IsNotEqual(ss2.GetString(), "aa", __LINE__);

    str = String<char>("a");
    ss2 += str;
    test.IsEqual(ss2.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{1}), __LINE__);
    test.IsEqual(ss2, "a", __LINE__);
    test.IsNotEqual(ss2, "aa", __LINE__);

    ss2.Reset();

    ss2 += "abc";
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2.GetString(), "abc", __LINE__);
    const String<char> sss;

    ss2 += String<char>("abc");
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2, "abc", __LINE__);
    ss2.Reset();

    str = String<char>("abc");
    ss2 += str;
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2, "abc", __LINE__);
    ss2.Reset();

    ss2 += String<char>("abc");
    ss1 = ss2; // Copy
    test.IsEqual(ss1.Length(), ss2.Length(), __LINE__);
    test.IsTrue((ss1.Capacity() >= ss2.Length()), __LINE__);
    test.IsEqual(ss1, "abc", __LINE__);
    ss1.Reset();

    const SizeT lss = ss1.Capacity();

    ss1.Clear();
    test.IsEqual(ss1.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss1.Capacity(), lss, __LINE__);

    ss1.Reset();
    ss1 = Memory::Move(ss2); // Move
    test.IsEqual(ss1.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss1.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss1, "abc", __LINE__);
    test.IsNull(ss2.Storage(), __LINE__);
    test.IsEqual(ss2.Length(), SizeT{0}, __LINE__);
    test.IsEqual(ss2.Capacity(), SizeT{0}, __LINE__);
    test.IsNull(ss2.First(), __LINE__);

    ss2 += 'a';
    ss1.Reset();
    ss1 = Memory::Move(ss2); // Move
    test.IsEqual(ss1.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss1.Capacity() >= SizeT{4}), __LINE__);
    test.IsEqual(ss1, "a", __LINE__);
    ss1.Reset();

    ss1 += "abc";
    ss2 = StringStream<char>(ss1); // Copy
    test.IsEqual(ss1.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss1.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss1, "abc", __LINE__);
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2, "abc", __LINE__);
    ss1.Reset();
    ss2.Reset();

    ss1 += "efg";
    ss2 = StringStream<char>(Memory::Move(ss1)); // Move
    test.IsNull(ss1.Storage(), __LINE__);
    test.IsEqual(ss1.Length(), SizeT{0}, __LINE__);
    test.IsTrue((ss1.Capacity() == SizeT{0}), __LINE__);
    test.IsNull(ss1.First(), __LINE__);
    test.IsEqual(ss2, "efg", __LINE__);
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2.First()[2], 'g', __LINE__);

    ss2.Reset();
    ss2.Write("a", SizeT{1});
    test.IsEqual(ss2.Length(), SizeT{1}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{1}), __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{1}), __LINE__);
    test.IsNotNull(ss2.First(), __LINE__);
    test.IsEqual(ss2.First()[0], 'a', __LINE__);

    ss2.Write("bc", SizeT{2});
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{3}), __LINE__);
    test.IsEqual(ss2, "abc", __LINE__);
    ss2.Reset();

    ss2.Write("abcdef", SizeT{1});
    ss2.Write("bcdef", SizeT{1});
    ss2.Write("cdef", SizeT{1});

    char      *e_str    = ss2.Detach();
    const bool is_equal = StringUtils::IsEqual(e_str, "abc", SizeT{3});
    Memory::Deallocate(e_str);

    test.IsTrue(is_equal, __LINE__);

    ss2 += "abcdef";
    ss2.StepBack(10);
    test.IsEqual(ss2.Length(), SizeT{6}, __LINE__);

    ss2.StepBack(1);
    test.IsEqual(ss2.Length(), SizeT{5}, __LINE__);

    ss2.StepBack(2);
    test.IsEqual(ss2.Length(), SizeT{3}, __LINE__);

    ss2.StepBack(3);
    test.IsEqual(ss2.Length(), SizeT{0}, __LINE__);

    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";
    ss2 += "123456789";

    test.IsEqual(ss2.Length(), SizeT{117}, __LINE__);
    test.IsTrue((ss2.Capacity() >= SizeT{117}), __LINE__);
    test.IsEqual(
        ss2,
        "123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789123456789",
        __LINE__);

    ss1.Reset();
    ss2.Reset();

    ss1.SetLength(2);
    test.IsEqual(ss1.Length(), SizeT{2}, __LINE__);

    char *buffer = ss1.Storage();
    buffer[0]    = 'a';
    buffer[1]    = 'b';

    const char *ab = "ab";

    test.IsEqual(ss1.Length(), SizeT{2}, __LINE__);
    test.IsTrue(StringUtils::IsEqual(ss1.First(), ab, SizeT{2}), __LINE__);

    buffer = ss1.Buffer(1);
    test.IsEqual(ss1.Length(), SizeT{3}, __LINE__);

    buffer[0]       = 'c';
    const char *ab2 = "abc";
    test.IsEqual(ss1.Length(), SizeT{3}, __LINE__);
    test.IsTrue(StringUtils::IsEqual(ss1.First(), ab2, SizeT{3}), __LINE__);

    ss2.Clear();
    ss2 += "ab";
    test.IsEqual((ss1 == ss2), false, __LINE__);

    ss1 += "de";
    test.IsEqual(ss1.Length(), SizeT{5}, __LINE__);
    test.IsEqual(ss1, "abcde", __LINE__);

    ss2 = ss1;
    test.IsEqual(ss2.Length(), SizeT{5}, __LINE__);
    test.IsEqual(ss2, "abcde", __LINE__);

    ss2.Reset();

    /////////
    ss2 += "123456789123456789123456789123456789";
    const char *ss2_p = ss2.First();
    str               = ss2.GetString();
    test.IsEqual(ss2_p, str.First(), __LINE__);
    test.IsEqual(str, "123456789123456789123456789123456789", __LINE__);

    /////////

    ss2.Reset();

    ss1 = "abcdefgh";
    test.IsEqual(ss1, "abcdefgh", __LINE__);

    ss2 << ss1;
    test.IsEqual(ss1, "abcdefgh", __LINE__);
    test.IsEqual(ss2, "abcdefgh", __LINE__);

    const String<char> n_str = String<char>("12345678");
    ss1                      = n_str;
    test.IsEqual(ss1, "12345678", __LINE__);

    ss2.Reset();

    ss2 << n_str;
    test.IsEqual(ss2, "12345678", __LINE__);

    struct SimpleStream {
        char          str[32]{0};
        const SizeT32 max = 32U;
        SizeT32       index{0};

        void operator<<(const char ch) noexcept {
            str[index] = ch;
            ++index;
        }
    };

    SimpleStream sis;
    sis << ss2;
    test.IsTrue(StringUtils::IsEqual(&(sis.str[0]), "12345678", SizeT{8}), __LINE__);

    ss2 << n_str;
    test.IsEqual(ss2, "1234567812345678", __LINE__);
    test.IsEqual(ss2.Capacity(), SizeT{32}, __LINE__);

    ss2 << "1234567812345678";
    sis.index = SizeT{0};
    sis << ss2;

    test.IsTrue(StringUtils::IsEqual(&(sis.str[0]), "12345678123456781234567812345678", SizeT{32}), __LINE__);

    ss2.StepBack(1);
    sis.index = SizeT{0};
    sis << ss2;
    test.IsTrue(StringUtils::IsEqual(&(sis.str[0]), "1234567", SizeT{7}), __LINE__);
}